

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O1

TreeNode *
si9ma::BinaryTree::restore_process_pre_order
          (queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *str)

{
  char *__nptr;
  int iVar1;
  char *in_RAX;
  TreeNode *this;
  int *piVar2;
  long lVar3;
  TreeNode *pTVar4;
  undefined8 uVar5;
  char *local_38;
  
  local_38 = in_RAX;
  iVar1 = std::__cxx11::string::compare
                    ((char *)(str->c).
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  if (iVar1 == 0) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&str->c);
    return (TreeNode *)0x0;
  }
  this = (TreeNode *)operator_new(0x20);
  __nptr = (((str->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    TreeNode::TreeNode(this,(int)lVar3);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&str->c);
    pTVar4 = restore_process_pre_order(str);
    this->left = pTVar4;
    pTVar4 = restore_process_pre_order(str);
    this->right = pTVar4;
    return this;
  }
  uVar5 = std::__throw_out_of_range("stoi");
  operator_delete(this);
  _Unwind_Resume(uVar5);
}

Assistant:

TreeNode* BinaryTree::restore_process_pre_order(queue<string>& str) {
        if ("#" == str.front()){
            str.pop();
            return nullptr;
        }

        auto *head = new TreeNode(stoi(str.front()));
        str.pop();
        head->left = restore_process_pre_order(str);
        head->right = restore_process_pre_order(str);

        return head;
    }